

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

int __thiscall cppcms::http::context::on_headers_ready(context *this)

{
  bool bVar1;
  element_type *peVar2;
  application_specific_pool *this_00;
  request *srv;
  request *this_01;
  unsigned_long_long uVar3;
  application *paVar4;
  _data *p_Var5;
  long in_RDI;
  context_guard g;
  int flags;
  shared_ptr<cppcms::application_specific_pool> pool;
  intrusive_ptr<cppcms::application> app;
  string matched;
  char *script_name;
  char *path_info;
  char *host;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  application *in_stack_fffffffffffffeb8;
  context_guard *in_stack_fffffffffffffec0;
  request *in_stack_fffffffffffffed0;
  string local_a8 [48];
  uint local_78;
  undefined4 local_74;
  __shared_ptr local_70 [24];
  string *in_stack_ffffffffffffffa8;
  intrusive_ptr<cppcms::application> in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  applications_pool *in_stack_ffffffffffffffc8;
  int local_4;
  
  peVar2 = std::
           __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a2d40);
  (*peVar2->_vptr_connection[0x17])();
  peVar2 = std::
           __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a2d64);
  (*peVar2->_vptr_connection[0x16])();
  peVar2 = std::
           __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a2d88);
  (*peVar2->_vptr_connection[0x15])();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)&stack0xffffffffffffffb0);
  service((context *)0x3a2dc8);
  this_00 = (application_specific_pool *)cppcms::service::applications_pool((service *)0x3a2ddf);
  applications_pool::get_application_specific_pool
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)in_stack_ffffffffffffffb0.p_,in_stack_ffffffffffffffa8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_70);
  if (bVar1) {
    srv = request((context *)0x3a2e8b);
    http::request::prepare(in_stack_fffffffffffffed0);
    this_01 = request((context *)0x3a2eb1);
    uVar3 = http::request::content_length((request *)0x3a2ec8);
    if (uVar3 != 0) {
      std::
      __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3a2eeb);
      local_78 = application_specific_pool::flags((application_specific_pool *)0x3a2ef3);
      if (((local_78 & 0xf) != 0) && ((local_78 & 0x40) != 0)) {
        std::
        __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3a2f30);
        service((context *)0x3a2f42);
        application_specific_pool::get(this_00,(service *)srv);
        booster::intrusive_ptr<cppcms::application>::operator=
                  ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffec0,
                   (intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffeb8);
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                  ((intrusive_ptr<cppcms::application> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        bVar1 = booster::intrusive_ptr<cppcms::application>::operator!
                          ((intrusive_ptr<cppcms::application> *)&stack0xffffffffffffffb0);
        if (bVar1) {
          local_4 = 500;
          goto LAB_003a31f8;
        }
        booster::intrusive_ptr<cppcms::application>::get
                  ((intrusive_ptr<cppcms::application> *)&stack0xffffffffffffffb0);
        anon_unknown_3::context_guard::context_guard
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        paVar4 = booster::intrusive_ptr<cppcms::application>::operator->
                           ((intrusive_ptr<cppcms::application> *)&stack0xffffffffffffffb0);
        std::__cxx11::string::string(local_a8,(string *)&stack0xffffffffffffffb8);
        (*paVar4->_vptr_application[2])(paVar4,local_a8);
        std::__cxx11::string::~string(local_a8);
        anon_unknown_3::context_guard::~context_guard
                  ((context_guard *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
    }
    booster::hold_ptr<cppcms::http::context::_data>::operator->
              ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
    std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::swap
              ((__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    p_Var5 = booster::hold_ptr<cppcms::http::context::_data>::operator->
                       ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
    std::__cxx11::string::swap((string *)&p_Var5->matched);
    p_Var5 = booster::hold_ptr<cppcms::http::context::_data>::operator->
                       ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
    booster::intrusive_ptr<cppcms::application>::swap
              (&p_Var5->app,(intrusive_ptr<cppcms::application> *)&stack0xffffffffffffffb0);
    request((context *)0x3a31cb);
    in_stack_fffffffffffffeb4 = http::request::on_content_start(this_01);
    local_4 = in_stack_fffffffffffffeb4;
  }
  else {
    local_4 = 0x194;
  }
LAB_003a31f8:
  local_74 = 1;
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3a3205);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return local_4;
}

Assistant:

int context::on_headers_ready()
{
	char const *host = conn_->env_http_host();
	char const *path_info = conn_->env_path_info();
	char const *script_name = conn_->env_script_name();
	std::string matched;

	booster::intrusive_ptr<application> app;
	booster::shared_ptr<application_specific_pool> pool = 
		service().applications_pool().get_application_specific_pool(
			host,
			script_name,
			path_info,
			matched
			);
	if(!pool)
		return 404;
	
	request().prepare();

	int flags;
	
	if(request().content_length() != 0 && ((flags=pool->flags()) & app::op_mode_mask) != app::synchronous && (flags & app::content_filter)!=0) {
		app = pool->get(service());
		if(!app)
			return 500;
		try {
			context_guard g(app.get(),*this);
			app->main(matched);
		}
		catch(...) {
			return translate_exception();
		}
	}

	d->pool.swap(pool);
	d->matched.swap(matched);
	d->app.swap(app);
	
	return request().on_content_start();
}